

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerApp::Create
                  (Error *__return_storage_ptr__,
                  shared_ptr<ot::commissioner::CommissionerApp> *aCommApp,Config *aConfig)

{
  ErrorCode EVar1;
  CommissionerApp *this;
  Error *pEVar2;
  shared_ptr<ot::commissioner::CommissionerApp> app;
  __shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  this = (CommissionerApp *)operator_new(0x368);
  memset(this,0,0x368);
  CommissionerApp(this);
  std::__shared_ptr<ot::commissioner::CommissionerApp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ot::commissioner::CommissionerApp,void>
            ((__shared_ptr<ot::commissioner::CommissionerApp,(__gnu_cxx::_Lock_policy)2> *)&local_60
             ,this);
  Init((Error *)local_50,local_60._M_ptr,aConfig);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_50);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_50 + 8));
  if (EVar1 == kNone) {
    if ((aConfig->mCommissionerToken).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (aConfig->mCommissionerToken).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (*((local_60._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x43])
                (local_50,local_60._M_ptr,&aConfig->mCommissionerToken);
      std::__cxx11::string::~string((string *)(local_50 + 8));
    }
    std::__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&aCommApp->
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>,
               &local_60);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::Create(std::shared_ptr<CommissionerApp> &aCommApp, const Config &aConfig)
{
    Error error;
    auto  app = std::shared_ptr<CommissionerApp>(new CommissionerApp());

    SuccessOrExit(error = app->Init(aConfig));
    if (aConfig.mCommissionerToken.size() > 0)
    {
        app->SetToken(aConfig.mCommissionerToken).IgnoreError();
    }

    aCommApp = app;

exit:
    return error;
}